

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRZ.cpp
# Opt level: O0

void __thiscall OpenMD::GofRZ::writeRdf(GofRZ *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  undefined8 uVar7;
  long in_RDI;
  uint j;
  uint i;
  ofstream rdfStream;
  uint local_21c;
  uint local_218;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar7 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"GofRZ: unable to open %s\n",uVar7);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<(local_208,"#radial distribution function\n");
    poVar3 = std::operator<<(local_208,"#selection1: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xd0));
    std::operator<<(poVar3,")\t");
    poVar3 = std::operator<<(local_208,"selection2: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xf0));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"#nBins = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)(in_RDI + 0x34));
    poVar3 = std::operator<<(poVar3,"\t maxLen = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0xfb0));
    poVar3 = std::operator<<(poVar3,"deltaR = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0xfc8));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"#n");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x1018));
    poVar3 = std::operator<<(poVar3,"Bins =");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0xfd0));
    poVar3 = std::operator<<(poVar3,"\t delta");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x1018));
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0xfd8));
    std::operator<<(poVar3,"\n");
    for (local_218 = 0;
        sVar4 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)(in_RDI + 0xff8)), local_218 < sVar4; local_218 = local_218 + 1) {
      local_21c = 0;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xff8),(ulong)local_218);
        sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
        if (sVar4 <= local_21c) break;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0xff8),(ulong)local_218);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_21c);
        poVar3 = (ostream *)
                 std::ostream::operator<<(local_208,*pvVar6 / (double)*(int *)(in_RDI + 0x110));
        std::operator<<(poVar3,"\t");
        local_21c = local_21c + 1;
      }
      std::operator<<(local_208,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void GofRZ::writeRdf() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#radial distribution function\n";
      rdfStream << "#selection1: (" << selectionScript1_ << ")\t";
      rdfStream << "selection2: (" << selectionScript2_ << ")\n";
      rdfStream << "#nBins = " << nBins_ << "\t maxLen = " << len_
                << "deltaR = " << deltaR_ << "\n";
      rdfStream << "#n" << axisLabel_ << "Bins =" << nZBins_ << "\t delta"
                << axisLabel_ << " = " << deltaZ_ << "\n";
      for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
        // RealType r = deltaR_ * (i + 0.5);

        for (unsigned int j = 0; j < avgGofr_[i].size(); ++j) {
          // RealType z = deltaZ_ * (j + 0.5);
          rdfStream << avgGofr_[i][j] / nProcessed_ << "\t";
        }

        rdfStream << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofRZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }